

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONEncrypt(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  longlong in_stack_fffffffffffffd30;
  string s_stream_method;
  string s_string_method;
  string MODIFY_ANNOTATIONS;
  encryption_method_e file_method;
  encryption_method_e string_method;
  undefined1 local_260 [20];
  encryption_method_e stream_method;
  JSON j_parameters;
  JSON j_capabilities;
  int V;
  JSON j_encrypt;
  string local_210;
  int P;
  int R;
  string s_file_method;
  JSON key;
  string s_overall_method;
  JSON local_198;
  JSON local_188;
  JSON local_178;
  JSON local_168;
  JSON local_158;
  JSON local_148;
  JSON local_138;
  JSON local_128;
  JSON local_118;
  JSON local_108;
  JSON local_f8;
  JSON local_e8;
  JSON local_d8;
  JSON local_c8;
  JSON local_b8;
  JSON local_a8;
  JSON local_98;
  JSON local_88;
  JSON local_78;
  JSON local_68;
  JSON local_58;
  JSON local_48;
  JSON local_38;
  
  R = 0;
  P = 0;
  V = 0;
  stream_method = e_none;
  string_method = e_none;
  file_method = e_none;
  bVar1 = QPDF::isEncrypted(pdf,&R,&P,&V,&stream_method,&string_method,&file_method);
  JSON::makeDictionary();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"encrypted",(allocator<char> *)&s_string_method);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_38,(string *)&j_encrypt,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"userpasswordmatched",(allocator<char> *)&s_string_method
            );
  if (bVar1) {
    QPDF::userPasswordMatched(pdf);
  }
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_48,(string *)&j_encrypt,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"ownerpasswordmatched",
             (allocator<char> *)&s_string_method);
  if (bVar1) {
    QPDF::ownerPasswordMatched(pdf);
  }
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_58,(string *)&j_encrypt,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  if (((4 < V || !bVar1) || (bVar2 = QPDF::ownerPasswordMatched(pdf), !bVar2)) ||
     (bVar2 = QPDF::userPasswordMatched(pdf), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&MODIFY_ANNOTATIONS,"recovereduserpassword",
               (allocator<char> *)&s_string_method);
    JSON::makeNull();
    JSON::addDictionaryMember(&local_78,(string *)&j_encrypt,(JSON *)&MODIFY_ANNOTATIONS);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  }
  else {
    QPDF::getTrimmedUserPassword_abi_cxx11_(&MODIFY_ANNOTATIONS,pdf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s_stream_method,"recovereduserpassword",(allocator<char> *)&s_file_method)
    ;
    JSON::makeString(&s_string_method);
    JSON::addDictionaryMember(&local_68,(string *)&j_encrypt,(JSON *)&s_stream_method);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
    std::__cxx11::string::~string((string *)&s_stream_method);
  }
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"capabilities",(allocator<char> *)&s_string_method);
  JSON::makeDictionary();
  JSON::addDictionaryMember(&j_capabilities,(string *)&j_encrypt,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"accessibility",(allocator<char> *)&s_string_method);
  QPDF::allowAccessibility(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_88,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"extract",(allocator<char> *)&s_string_method);
  QPDF::allowExtractAll(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_98,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"printlow",(allocator<char> *)&s_string_method);
  QPDF::allowPrintLowRes(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_a8,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"printhigh",(allocator<char> *)&s_string_method);
  QPDF::allowPrintHighRes(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_b8,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"modifyassembly",(allocator<char> *)&s_string_method);
  QPDF::allowModifyAssembly(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_c8,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,"modifyforms",(allocator<char> *)&s_string_method);
  QPDF::allowModifyForm(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_d8,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  __s = "modifyannotations";
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_version == 1) {
    __s = "moddifyannotations";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MODIFY_ANNOTATIONS,__s,(allocator<char> *)&s_stream_method);
  QPDF::allowModifyAnnotation(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_e8,(string *)&j_capabilities,(JSON *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_stream_method._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"modifyother",(allocator<char> *)&s_file_method);
  QPDF::allowModifyOther(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_f8,(string *)&j_capabilities,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"modify",(allocator<char> *)&s_file_method);
  QPDF::allowModifyAll(pdf);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_108,(string *)&j_capabilities,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"parameters",(allocator<char> *)&s_file_method);
  JSON::makeDictionary();
  JSON::addDictionaryMember(&j_parameters,(string *)&j_encrypt,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"R",(allocator<char> *)&s_file_method);
  JSON::makeInt(in_stack_fffffffffffffd30);
  JSON::addDictionaryMember(&local_118,(string *)&j_parameters,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"V",(allocator<char> *)&s_file_method);
  JSON::makeInt(in_stack_fffffffffffffd30);
  JSON::addDictionaryMember(&local_128,(string *)&j_parameters,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"P",(allocator<char> *)&s_file_method);
  JSON::makeInt(in_stack_fffffffffffffd30);
  JSON::addDictionaryMember(&local_138,(string *)&j_parameters,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  JSON::makeNull();
  if (bVar1) {
    QPDF::getEncryptionKey_abi_cxx11_(&s_stream_method,pdf);
    s_string_method._M_dataplus._M_p = (pointer)(s_stream_method._M_string_length << 3);
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&s_string_method)
    ;
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        show_encryption_key == true) {
      QUtil::hex_encode(&s_string_method,&s_stream_method);
      JSON::makeString(&s_file_method);
      std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&key,
                 (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&s_file_method);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_file_method._M_string_length);
      std::__cxx11::string::~string((string *)&s_string_method);
    }
    std::__cxx11::string::~string((string *)&s_stream_method);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"bits",(allocator<char> *)&s_file_method);
  JSON::makeInt(in_stack_fffffffffffffd30);
  JSON::addDictionaryMember(&local_148,(string *)&j_parameters,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_string_method._M_string_length);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s_stream_method,"key",(allocator<char> *)&s_string_method);
  JSON::addDictionaryMember(&local_158,(string *)&j_parameters,(JSON *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&s_stream_method);
  if (stream_method == e_none && bVar1) {
    stream_method = e_rc4;
  }
  if (string_method == e_none && bVar1) {
    string_method = e_rc4;
  }
  if (bVar1 && file_method == e_none) {
    file_method = e_rc4;
  }
  show_encryption_method_abi_cxx11_(&s_stream_method,stream_method);
  show_encryption_method_abi_cxx11_(&s_string_method,string_method);
  show_encryption_method_abi_cxx11_(&s_file_method,file_method);
  s_overall_method._M_dataplus._M_p = (pointer)&s_overall_method.field_2;
  s_overall_method._M_string_length = 0;
  s_overall_method.field_2._M_local_buf[0] = '\0';
  if ((stream_method == string_method) && (stream_method == file_method)) {
    std::__cxx11::string::_M_assign((string *)&s_overall_method);
  }
  else {
    std::__cxx11::string::assign((char *)&s_overall_method);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"method",(allocator<char> *)&stack0xfffffffffffffd37);
  JSON::makeString((string *)local_260);
  JSON::addDictionaryMember(&local_168,(string *)&j_parameters,(JSON *)&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"streammethod",(allocator<char> *)&stack0xfffffffffffffd37);
  JSON::makeString((string *)local_260);
  JSON::addDictionaryMember(&local_178,(string *)&j_parameters,(JSON *)&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_178.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"stringmethod",(allocator<char> *)&stack0xfffffffffffffd37);
  JSON::makeString((string *)local_260);
  JSON::addDictionaryMember(&local_188,(string *)&j_parameters,(JSON *)&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"filemethod",(allocator<char> *)&stack0xfffffffffffffd37);
  JSON::makeString((string *)local_260);
  JSON::addDictionaryMember(&local_198,(string *)&j_parameters,(JSON *)&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"encrypt",(allocator<char> *)local_260);
  JSON::writeDictionaryItem(p,first,&local_210,&j_encrypt,1);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&s_overall_method);
  std::__cxx11::string::~string((string *)&s_file_method);
  std::__cxx11::string::~string((string *)&s_string_method);
  std::__cxx11::string::~string((string *)&s_stream_method);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&key.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_parameters.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&MODIFY_ANNOTATIONS);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_capabilities.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void
QPDFJob::doJSONEncrypt(Pipeline* p, bool& first, QPDF& pdf)
{
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_none;
    QPDF::encryption_method_e string_method = QPDF::e_none;
    QPDF::encryption_method_e file_method = QPDF::e_none;
    bool is_encrypted = pdf.isEncrypted(R, P, V, stream_method, string_method, file_method);
    JSON j_encrypt = JSON::makeDictionary();
    j_encrypt.addDictionaryMember("encrypted", JSON::makeBool(is_encrypted));
    j_encrypt.addDictionaryMember(
        "userpasswordmatched", JSON::makeBool(is_encrypted && pdf.userPasswordMatched()));
    j_encrypt.addDictionaryMember(
        "ownerpasswordmatched", JSON::makeBool(is_encrypted && pdf.ownerPasswordMatched()));
    if (is_encrypted && (V < 5) && pdf.ownerPasswordMatched() && (!pdf.userPasswordMatched())) {
        std::string user_password = pdf.getTrimmedUserPassword();
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeString(user_password));
    } else {
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeNull());
    }
    JSON j_capabilities = j_encrypt.addDictionaryMember("capabilities", JSON::makeDictionary());
    j_capabilities.addDictionaryMember("accessibility", JSON::makeBool(pdf.allowAccessibility()));
    j_capabilities.addDictionaryMember("extract", JSON::makeBool(pdf.allowExtractAll()));
    j_capabilities.addDictionaryMember("printlow", JSON::makeBool(pdf.allowPrintLowRes()));
    j_capabilities.addDictionaryMember("printhigh", JSON::makeBool(pdf.allowPrintHighRes()));
    j_capabilities.addDictionaryMember("modifyassembly", JSON::makeBool(pdf.allowModifyAssembly()));
    j_capabilities.addDictionaryMember("modifyforms", JSON::makeBool(pdf.allowModifyForm()));
    /* cSpell:ignore moddifyannotations */
    std::string MODIFY_ANNOTATIONS =
        (m->json_version == 1 ? "moddifyannotations" : "modifyannotations");
    j_capabilities.addDictionaryMember(
        MODIFY_ANNOTATIONS, JSON::makeBool(pdf.allowModifyAnnotation()));
    j_capabilities.addDictionaryMember("modifyother", JSON::makeBool(pdf.allowModifyOther()));
    j_capabilities.addDictionaryMember("modify", JSON::makeBool(pdf.allowModifyAll()));
    JSON j_parameters = j_encrypt.addDictionaryMember("parameters", JSON::makeDictionary());
    j_parameters.addDictionaryMember("R", JSON::makeInt(R));
    j_parameters.addDictionaryMember("V", JSON::makeInt(V));
    j_parameters.addDictionaryMember("P", JSON::makeInt(P));
    int bits = 0;
    JSON key = JSON::makeNull();
    if (is_encrypted) {
        std::string encryption_key = pdf.getEncryptionKey();
        bits = QIntC::to_int(encryption_key.length() * 8);
        if (m->show_encryption_key) {
            key = JSON::makeString(QUtil::hex_encode(encryption_key));
        }
    }
    j_parameters.addDictionaryMember("bits", JSON::makeInt(bits));
    j_parameters.addDictionaryMember("key", key);
    auto fix_method = [is_encrypted](QPDF::encryption_method_e& method) {
        if (is_encrypted && method == QPDF::e_none) {
            method = QPDF::e_rc4;
        }
    };
    fix_method(stream_method);
    fix_method(string_method);
    fix_method(file_method);
    std::string s_stream_method = show_encryption_method(stream_method);
    std::string s_string_method = show_encryption_method(string_method);
    std::string s_file_method = show_encryption_method(file_method);
    std::string s_overall_method;
    if ((stream_method == string_method) && (stream_method == file_method)) {
        s_overall_method = s_stream_method;
    } else {
        s_overall_method = "mixed";
    }
    j_parameters.addDictionaryMember("method", JSON::makeString(s_overall_method));
    j_parameters.addDictionaryMember("streammethod", JSON::makeString(s_stream_method));
    j_parameters.addDictionaryMember("stringmethod", JSON::makeString(s_string_method));
    j_parameters.addDictionaryMember("filemethod", JSON::makeString(s_file_method));
    JSON::writeDictionaryItem(p, first, "encrypt", j_encrypt, 1);
}